

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdMinBase(word *pTruth,int nVars,int *pVarsNew)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  long lVar16;
  
  auVar3 = _DAT_0093d220;
  if (0 < nVars) {
    lVar16 = (ulong)(uint)nVars - 1;
    auVar14._8_4_ = (int)lVar16;
    auVar14._0_8_ = lVar16;
    auVar14._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar6 = 0;
    auVar14 = auVar14 ^ _DAT_0093d220;
    auVar15 = _DAT_0093d210;
    do {
      auVar17 = auVar15 ^ auVar3;
      if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                  auVar14._4_4_ < auVar17._4_4_) & 1)) {
        pVarsNew[uVar6] = (int)uVar6;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        pVarsNew[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar16 + 2;
    } while ((nVars + 1U & 0xfffffffe) != uVar6);
    uVar6 = (ulong)(uint)nVars;
    if (0 < nVars) {
      do {
        if ((long)nVars < (long)uVar6) {
          __assert_fail("iVar < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x582,"int Abc_TtHasVar(word *, int, int)");
        }
        uVar13 = uVar6 - 1;
        if ((uint)nVars < 7) {
          if ((s_Truths6Neg[uVar13] &
              (*pTruth >> ((byte)(1 << ((byte)uVar13 & 0x1f)) & 0x3f) ^ *pTruth)) == 0)
          goto LAB_0050fb1c;
        }
        else {
          iVar1 = nVars - 6;
          if (uVar6 < 7) {
            if (iVar1 != 0x1f) {
              uVar7 = 1 << ((byte)iVar1 & 0x1f);
              if ((int)uVar7 < 2) {
                uVar7 = 1;
              }
              uVar9 = 0;
              do {
                if (((pTruth[uVar9] >> ((byte)(1 << ((byte)uVar13 & 0x1f)) & 0x3f) ^ pTruth[uVar9])
                    & s_Truths6Neg[uVar13]) != 0) goto LAB_0050fb37;
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
          }
          else if (iVar1 != 0x1f) {
            iVar5 = (int)uVar6 + -7;
            bVar4 = (byte)iVar5;
            uVar7 = 1 << (bVar4 & 0x1f);
            iVar8 = 2 << (bVar4 & 0x1f);
            uVar9 = 1;
            if (1 < (int)uVar7) {
              uVar9 = (ulong)uVar7;
            }
            pwVar10 = pTruth + (int)uVar7;
            pwVar11 = pTruth;
            do {
              if (iVar5 != 0x1f) {
                uVar12 = 0;
                do {
                  if (pwVar11[uVar12] != pwVar10[uVar12]) goto LAB_0050fb37;
                  uVar12 = uVar12 + 1;
                } while (uVar9 != uVar12);
              }
              pwVar11 = pwVar11 + iVar8;
              pwVar10 = pwVar10 + iVar8;
            } while (pwVar11 < pTruth + (1 << ((byte)iVar1 & 0x1f)));
          }
LAB_0050fb1c:
          Abc_TtSwapVars(pTruth,nVars,(int)uVar13,nVars - 1U);
          pVarsNew[uVar13] = pVarsNew[(long)nVars + -1];
          nVars = nVars - 1U;
        }
LAB_0050fb37:
        bVar2 = 1 < (long)uVar6;
        uVar6 = uVar13;
      } while (bVar2);
    }
  }
  return nVars;
}

Assistant:

int Dau_DsdMinBase( word * pTruth, int nVars, int * pVarsNew )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        pVarsNew[v] = v;
    for ( v = nVars - 1; v >= 0; v-- )
    {
        if ( Abc_TtHasVar( pTruth, nVars, v ) )
            continue;
        Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
        pVarsNew[v] = pVarsNew[--nVars];
    }
    return nVars;
}